

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall
front::irGenerator::irGenerator::ir_op
          (irGenerator *this,LeftVal *dest,RightVal *op1,RightVal *op2,Op op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  VarId *__p;
  OpInst *this_00;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_01;
  undefined1 local_e8 [16];
  undefined1 local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  anon_class_8_1_a78179b7_conflict local_b8;
  Op local_ac;
  VarId local_a8;
  undefined1 local_98 [24];
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_80;
  undefined1 local_50 [32];
  
  __p = (VarId *)operator_new(0x10);
  local_ac = op;
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_80.super__Rb_tree_header,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar4 = LeftValueToLabelId(this,(LeftVal *)&local_80.super__Rb_tree_header);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  __p->id = uVar4;
  local_e8._0_8_ = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),__p);
  uVar1 = local_e8._0_8_;
  local_c0 = (_Base_ptr)local_e8._8_8_;
  local_e8._8_8_ = (_Base_ptr)0x0;
  local_e8._0_8_ = (_func_int **)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[(byte)local_80.super__Rb_tree_header._M_node_count]._M_data)
            ((anon_class_1_0_00000001 *)&local_b8,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_80.super__Rb_tree_header);
  local_80.super__Rb_tree_header._M_node_count._0_1_ = 0xff;
  rightValueToValue((irGenerator *)local_e8,(RightVal *)this);
  uVar2 = local_e8._0_8_;
  local_c8 = (_Base_ptr)local_e8._8_8_;
  local_e8._8_8_ = (_Base_ptr)0x0;
  local_e8._0_8_ = (_func_int **)0x0;
  rightValueToValue((irGenerator *)local_e8,(RightVal *)this);
  uVar3 = local_e8._0_8_;
  local_d0 = (_Base_ptr)local_e8._8_8_;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8._0_8_ = (_func_int **)0x0;
  this_00 = (OpInst *)operator_new(0x60);
  local_a8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  local_a8.id = *(uint32_t *)(uVar1 + 8);
  local_b8.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)(local_98 + 8);
  local_80._0_1_ = *(undefined1 *)(uVar2 + 0x18);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)*(char *)(uVar2 + 0x18) + 1]._M_data)
            (&local_b8,(variant<int,_mir::inst::VarId> *)(uVar2 + 8));
  local_98._0_8_ = &PTR_display_001effc8;
  local_80._1_2_ = *(undefined2 *)(uVar2 + 0x19);
  local_b8.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)(local_50 + 8);
  local_50[0x18] = *(undefined1 *)(uVar3 + 0x18);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)*(char *)(uVar3 + 0x18) + 1]._M_data)
            (&local_b8,(variant<int,_mir::inst::VarId> *)(uVar3 + 8));
  local_50._0_8_ = &PTR_display_001effc8;
  local_50._25_2_ = *(undefined2 *)(uVar3 + 0x19);
  mir::inst::OpInst::OpInst(this_00,&local_a8,(Value *)local_98,(Value *)local_50,local_ac);
  local_e8._0_8_ = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::OpInst*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),this_00);
  uVar2 = local_e8._8_8_;
  uVar1 = local_e8._0_8_;
  local_e8._8_8_ = 0;
  local_e8._0_8_ = (_func_int **)0x0;
  this_01 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar2 + 8) = *(_Atomic_word *)(uVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar2 + 8) = *(_Atomic_word *)(uVar2 + 8) + 1;
    }
  }
  local_d8 = _S_red;
  local_e8._0_8_ = uVar1;
  local_e8._8_8_ = uVar2;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_01,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_e8);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[(byte)local_d8]._M_data)
            ((anon_class_1_0_00000001 *)&local_b8,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  if (local_d0 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0);
  }
  if (local_c8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8);
  }
  if (local_c0 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0);
  }
  return;
}

Assistant:

void irGenerator::ir_op(LeftVal dest, RightVal op1, RightVal op2,
                        mir::inst::Op op) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> op1Value;
  shared_ptr<Value> op2Value;
  shared_ptr<mir::inst::OpInst> opInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  op1Value = rightValueToValue(op1);
  op2Value = rightValueToValue(op2);

  opInst = shared_ptr<mir::inst::OpInst>(
      new mir::inst::OpInst(*destVarId, *op1Value, *op2Value, op));

  _funcNameToInstructions[_funcStack.back()].push_back(opInst);
}